

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.hpp
# Opt level: O3

ostream * websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::
          timestamp(ostream *os)

{
  size_t sVar1;
  char *__s;
  time_t t;
  char buffer [20];
  tm lt;
  time_t local_70;
  char local_68 [24];
  tm local_50;
  
  local_70 = time((time_t *)0x0);
  localtime_r(&local_70,&local_50);
  sVar1 = strftime(local_68,0x14,"%Y-%m-%d %H:%M:%S",&local_50);
  __s = "Unknown";
  if (sVar1 != 0) {
    __s = local_68;
  }
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
  return os;
}

Assistant:

static std::ostream & timestamp(std::ostream & os) {
        std::time_t t = std::time(NULL);
        std::tm lt = lib::localtime(t);
        #ifdef _WEBSOCKETPP_PUTTIME_
            return os << std::put_time(&lt,"%Y-%m-%d %H:%M:%S");
        #else // Falls back to strftime, which requires a temporary copy of the string.
            char buffer[20];
            size_t result = std::strftime(buffer,sizeof(buffer),"%Y-%m-%d %H:%M:%S",&lt);
            return os << (result == 0 ? "Unknown" : buffer);
        #endif
    }